

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Op.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::StringOp::StringOp(StringOp *this,opType type,XMLCh *literal,MemoryManager *manager)

{
  XMLCh *pXVar1;
  
  (this->super_Op).fMemoryManager = manager;
  (this->super_Op).fOpType = type;
  (this->super_Op).fNextOp = (Op *)0x0;
  (this->super_Op)._vptr_Op = (_func_int **)&PTR__StringOp_003f9c18;
  pXVar1 = XMLString::replicate(literal,manager);
  this->fLiteral = pXVar1;
  return;
}

Assistant:

StringOp::StringOp(const Op::opType type, const XMLCh* const literal
                   , MemoryManager* const manager)
    : Op (type, manager)
      , fLiteral(XMLString::replicate(literal, manager)) {

}